

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

void __thiscall
soul::ResolutionPass::ResolutionPass(ResolutionPass *this,Allocator *a,ModuleBase *m)

{
  Allocator *pAVar1;
  char *__s;
  allocator<char> local_a5 [13];
  string local_98;
  IdentifierPath local_78;
  ModuleBase *local_20;
  ModuleBase *m_local;
  Allocator *a_local;
  ResolutionPass *this_local;
  
  this->allocator = a;
  this->module = m;
  local_20 = m;
  m_local = (ModuleBase *)a;
  a_local = (Allocator *)this;
  IdentifierPath::IdentifierPath(&this->intrinsicsNamespacePath);
  pAVar1 = this->allocator;
  __s = getIntrinsicsNamespaceName();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,__s,local_a5);
  IdentifierPath::fromString(&local_78,&pAVar1->identifiers,&local_98);
  IdentifierPath::operator=(&this->intrinsicsNamespacePath,&local_78);
  IdentifierPath::~IdentifierPath(&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(local_a5);
  return;
}

Assistant:

ResolutionPass (AST::Allocator& a, AST::ModuleBase& m) : allocator (a), module (m)
    {
        intrinsicsNamespacePath = IdentifierPath::fromString (allocator.identifiers, getIntrinsicsNamespaceName());
    }